

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O1

LinkedSection * next_secdef(GlobalVars *gv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  char *name;
  LinkedSection *pLVar5;
  MemoryDescr *pMVar6;
  LinkedSection *unaff_R15;
  lword s_lma;
  lword s_addr;
  char s_type [256];
  lword local_148;
  lword local_140;
  char local_138 [264];
  
  level = 1;
  current_ls = (LinkedSection *)0x0;
  do {
    while( true ) {
      do {
        while (name = getarg('\x01'), name == (char *)0x0) {
          cVar2 = getchr();
          if (cVar2 != ';') {
            back(1);
            return (LinkedSection *)0x0;
          }
        }
        iVar3 = check_command(gv,name,2);
      } while (iVar3 != 0);
      cVar2 = getchr();
      if (cVar2 != '=') break;
      symbol_assignment(gv,name,'\0');
    }
    back(1);
    pLVar5 = find_lnksec(gv,name,'\0','\0','\0','\0');
    if (pLVar5 == (LinkedSection *)0x0) {
      ierror("next_secdef(): No Section for %s defined",name);
LAB_001133ea:
      bVar1 = true;
    }
    else {
      current_ls = pLVar5;
      uVar4 = startofsecdef(&local_140,local_138,&local_148);
      if (uVar4 == 0) goto LAB_001133ea;
      if ((uVar4 & 2) != 0) {
        change_address(pLVar5->relocmem,local_140);
      }
      if (3 < uVar4) {
        if (pLVar5->destmem == pLVar5->relocmem) {
          pMVar6 = add_memblock("lma",0,0x7fffffffffffffff);
          pLVar5->destmem = pMVar6;
        }
        change_address(pLVar5->destmem,local_148);
      }
      secdefbase = (char *)0x0;
      bVar1 = false;
      unaff_R15 = pLVar5;
    }
    if (!bVar1) {
      return unaff_R15;
    }
  } while( true );
}

Assistant:

struct LinkedSection *next_secdef(struct GlobalVars *gv)
/* Find next section definition in script and return the machting
   structure. */
{
  char *keyword;
  struct Phdr *p;

  level = 1;
  current_ls = NULL;

  do {
    while (keyword = getword()) {
      if (check_command(gv,keyword,SCMDF_GLOBAL)) {
        continue;
      }
      else if (getchr() == '=') {
        symbol_assignment(gv,keyword,0);
      }

      else {
        /* check for section definition */
        char s_type[MAXLEN];
        struct LinkedSection *ls;
        int ret;
        lword s_addr,s_lma;

        back(1);
        if (ls = find_lnksec(gv,keyword,0,0,0,0)) {
          current_ls = ls;
          if (ret = startofsecdef(&s_addr,s_type,&s_lma)) {
            if (ret & 2)
              change_address(ls->relocmem,s_addr);
            if (ret & 4) {
              if (ls->destmem == ls->relocmem)
                ls->destmem = add_memblock("lma",MEM_DEFORG,MEM_DEFLEN);
              change_address(ls->destmem,s_lma);
            }

            secdefbase = NULL;
            return ls;
          }
        }
        else
          ierror("next_secdef(): No Section for %s defined",keyword);
      }
    }
  }
  while (getchr() == ';');
  back(1);

#if 0 /* @@@ don't do it - it modifies header size !!! */
  /* scan for empty segments and declare them as unused */
  for (p=gv->phdrlist; p; p=p->next) {
    if (p->type!=PT_PHDR && (p->start==ADDR_NONE || p->start_vma==ADDR_NONE)) {
      p->start = p->start_vma = p->file_end = p->mem_end = 0;
      p->flags &= ~PHDR_USED;
    }
  }
#endif
  return NULL;
}